

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

void collect_gradient_attributes(element_t *element,gradient_attributes_t *attributes)

{
  element *peVar1;
  _Bool _Var2;
  element **ppeVar3;
  
  if ((attributes->units == (element_t *)0x0) && (_Var2 = has_attribute(element,0xf), _Var2)) {
    attributes->units = element;
  }
  if ((attributes->spread == (element_t *)0x0) && (_Var2 = has_attribute(element,0x1a), _Var2)) {
    attributes->spread = element;
  }
  if ((attributes->transform == (element_t *)0x0) && (_Var2 = has_attribute(element,0xe), _Var2)) {
    attributes->transform = element;
  }
  if (attributes->stops == (element_t *)0x0) {
    ppeVar3 = &element->first_child;
    do {
      peVar1 = *ppeVar3;
      if (peVar1 == (element *)0x0) {
        return;
      }
      ppeVar3 = &peVar1->next_sibling;
    } while (peVar1->id != 0xe);
    attributes->stops = element;
  }
  return;
}

Assistant:

static void collect_gradient_attributes(const element_t* element, gradient_attributes_t* attributes)
{
    if(attributes->units == NULL && has_attribute(element, ATTR_GRADIENT_UNITS))
        attributes->units = element;
    if(attributes->spread == NULL && has_attribute(element, ATTR_SPREAD_METHOD))
        attributes->spread = element;
    if(attributes->transform == NULL && has_attribute(element, ATTR_GRADIENT_TRANSFORM))
        attributes->transform = element;
    if(attributes->stops == NULL) {
        for(const element_t* child = element->first_child; child; child = child->next_sibling) {
            if(child->id == TAG_STOP) {
                attributes->stops = element;
                break;
            }
        }
    }
}